

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  size_t sVar1;
  ctrl_t *pcVar2;
  TypeInfo *pTVar3;
  bool bVar4;
  uintptr_t v;
  slot_type *psVar5;
  ulong uVar6;
  ulong uVar7;
  size_t hash;
  size_t extraout_RDX;
  size_t hash_00;
  byte bVar8;
  undefined8 uVar9;
  size_t sVar10;
  ctrl_t cVar11;
  ulong uVar12;
  bool bVar13;
  FindInfo FVar14;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  slot_type *local_58;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  char local_37;
  byte local_36;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  sVar1 = common->capacity_;
  if (sVar1 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  if (sVar1 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                *)common);
    bVar13 = 1 < common->size_;
  }
  else {
    bVar13 = false;
  }
  bVar8 = 0x80;
  if (bVar13 != false) {
    psVar5 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                       *)common);
    uVar7 = ((ulong)(psVar5->value).first ^ 0x1976508) * -0x234dd359734ecb13;
    bVar8 = (byte)(((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                     (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                     (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                     (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)(psVar5->value).first) *
                   0x5cb22ca68cb134ed >> 0x38) & 0x7f;
  }
  local_40 = common->capacity_;
  local_38 = (byte)common->size_ & 1;
  local_37 = sVar1 == 1;
  local_50.heap.control = (common->heap_or_soo_).heap.control;
  local_50.heap.slot_array = (MaybeInitializedPtr)(common->heap_or_soo_).heap.slot_array.p;
  local_36 = bVar13;
  CommonFields::set_capacity(common,new_capacity);
  bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,16ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_50,common,&local_59,(int)(char)bVar8,8,0x10);
  if (local_40 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  if ((bVar13 | sVar1 != 1) == 1) {
    local_58 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                           *)common);
    if (!bVar4) {
      if (sVar1 == 1) {
        uVar7 = ((ulong)local_50.heap.control ^ 0x1976508) * -0x234dd359734ecb13;
        uVar12 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                   (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                   (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                  | uVar7 << 0x38) ^ (ulong)local_50.heap.control) * -0x234dd359734ecb13;
        FVar14 = find_first_non_full<void>
                           ((container_internal *)common,
                            (CommonFields *)
                            (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                             (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                             (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                             (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38),hash);
        uVar6 = FVar14.offset;
        uVar7 = common->capacity_;
        if (uVar7 <= uVar6) {
LAB_00f7fd01:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar6] = cVar11;
        pcVar2[(ulong)((uint)uVar7 & 0xf) + (uVar6 - 0xf & uVar7)] = cVar11;
        common->capacity_ = 0xffffffffffffff9c;
        local_58[uVar6].value.first = (Descriptor *)local_50.heap.control;
        local_58[uVar6].value.second = (TypeInfo *)local_50.heap.slot_array;
        CommonFields::set_capacity(common,uVar7);
      }
      else {
        if (local_37 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          sVar10 = 0;
          hash_00 = hash;
          uVar9 = local_50.heap.slot_array;
          do {
            if (local_37 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_50.heap.control[sVar10]) {
              uVar7 = (*(ulong *)uVar9 ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                      -0x234dd359734ecb13;
              uVar12 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                         (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                         (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                         (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ *(ulong *)uVar9) *
                       -0x234dd359734ecb13;
              FVar14 = find_first_non_full<void>
                                 ((container_internal *)common,
                                  (CommonFields *)
                                  (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                                   (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8
                                   | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                                   (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38),hash_00);
              uVar6 = FVar14.offset;
              uVar7 = common->capacity_;
              if (uVar7 <= uVar6) goto LAB_00f7fd01;
              cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar6] = cVar11;
              pcVar2[(ulong)((uint)uVar7 & 0xf) + (uVar6 - 0xf & uVar7)] = cVar11;
              common->capacity_ = 0xffffffffffffff9c;
              pTVar3 = *(TypeInfo **)(uVar9 + 8);
              local_58[uVar6].value.first = *(Descriptor **)uVar9;
              local_58[uVar6].value.second = pTVar3;
              CommonFields::set_capacity(common,uVar7);
              hash_00 = extraout_RDX;
            }
            sVar10 = sVar10 + 1;
            uVar9 = uVar9 + 0x10;
          } while (sVar10 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      if (sVar1 != 1) {
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_50,&local_5a,0x10);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }